

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_template_part(JSParseState *s,uint8_t *p)

{
  byte bVar1;
  int iVar2;
  uint c;
  char *fmt;
  byte *pbVar3;
  JSValue JVar4;
  uint8_t *p_next;
  StringBuffer local_50;
  
  iVar2 = string_buffer_init(s->ctx,&local_50,0x20);
  if (iVar2 == 0) {
    do {
      if (s->buf_end <= p) {
LAB_00145c45:
        fmt = "unexpected end of string";
LAB_00145c4c:
        js_parse_error(s,fmt);
        break;
      }
      pbVar3 = p + 1;
      bVar1 = *p;
      if (bVar1 == 0x24) {
        c = 0x24;
        if (*pbVar3 == 0x7b) {
          pbVar3 = p + 2;
LAB_00145c84:
          (s->token).val = -0x7e;
          (s->token).u.str.sep = (uint)bVar1;
          JVar4 = string_buffer_end(&local_50);
          (s->token).u.str.str = JVar4;
          s->buf_ptr = pbVar3;
          return 0;
        }
      }
      else {
        if (bVar1 == 0x5c) {
          iVar2 = string_buffer_putc8(&local_50,0x5c);
          if (iVar2 != 0) break;
          if (s->buf_end <= pbVar3) goto LAB_00145c45;
          bVar1 = p[1];
          pbVar3 = p + 2;
        }
        else if (bVar1 == 0x60) goto LAB_00145c84;
        c = (uint)bVar1;
        if (c != 10) {
          if (c != 0xd) {
            if ((0x7f < c) &&
               (c = unicode_from_utf8(pbVar3 + -1,6,&p_next), pbVar3 = p_next, 0x10ffff < c)) {
              fmt = "invalid UTF-8 sequence";
              goto LAB_00145c4c;
            }
            goto LAB_00145c30;
          }
          pbVar3 = pbVar3 + (*pbVar3 == 10);
        }
        s->line_num = s->line_num + 1;
        c = 10;
      }
LAB_00145c30:
      p = pbVar3;
      iVar2 = string_buffer_putc(&local_50,c);
    } while (iVar2 == 0);
  }
  (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
  return -1;
}

Assistant:

static __exception int js_parse_template_part(JSParseState *s, const uint8_t *p)
{
    uint32_t c;
    StringBuffer b_s, *b = &b_s;

    /* p points to the first byte of the template part */
    if (string_buffer_init(s->ctx, b, 32))
        goto fail;
    for(;;) {
        if (p >= s->buf_end)
            goto unexpected_eof;
        c = *p++;
        if (c == '`') {
            /* template end part */
            break;
        }
        if (c == '$' && *p == '{') {
            /* template start or middle part */
            p++;
            break;
        }
        if (c == '\\') {
            if (string_buffer_putc8(b, c))
                goto fail;
            if (p >= s->buf_end)
                goto unexpected_eof;
            c = *p++;
        }
        /* newline sequences are normalized as single '\n' bytes */
        if (c == '\r') {
            if (*p == '\n')
                p++;
            c = '\n';
        }
        if (c == '\n') {
            s->line_num++;
        } else if (c >= 0x80) {
            const uint8_t *p_next;
            c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
                js_parse_error(s, "invalid UTF-8 sequence");
                goto fail;
            }
            p = p_next;
        }
        if (string_buffer_putc(b, c))
            goto fail;
    }
    s->token.val = TOK_TEMPLATE;
    s->token.u.str.sep = c;
    s->token.u.str.str = string_buffer_end(b);
    s->buf_ptr = p;
    return 0;

 unexpected_eof:
    js_parse_error(s, "unexpected end of string");
 fail:
    string_buffer_free(b);
    return -1;
}